

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

Offset<reflection::EnumVal> __thiscall
flatbuffers::EnumVal::Serialize(EnumVal *this,FlatBufferBuilder *builder,Parser *parser)

{
  Offset<flatbuffers::String> off;
  uoffset_t start;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  begin;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  end;
  long e;
  Offset<reflection::Type> off_00;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_> off_01;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_> off_02;
  Offset<reflection::EnumVal> table;
  
  FlatBufferBuilderImpl<false>::CreateStringImpl
            (builder,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
  off.o = (builder->buf_).size_;
  off_00 = Type::Serialize(&this->union_type,builder);
  off_01 = SerializeAttributesCommon(&this->attributes,builder,parser);
  off_02.o = 0;
  if ((parser->opts).binary_schema_comments == true) {
    begin._M_current =
         (this->doc_comment).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    end._M_current =
         (this->doc_comment).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    off_02.o = 0;
    if (begin._M_current != end._M_current) {
      off_02 = FlatBufferBuilderImpl<false>::
               CreateVectorOfStrings<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                         (builder,begin,end);
    }
  }
  e = this->value;
  FlatBufferBuilderImpl<false>::NotNested(builder);
  builder->nested = true;
  start = (builder->buf_).size_;
  FlatBufferBuilderImpl<false>::AddElement<long>(builder,6,e,0);
  FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,unsigned_int>>
            (builder,0xe,off_01);
  FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,unsigned_int>>
            (builder,0xc,off_02);
  FlatBufferBuilderImpl<false>::AddOffset<reflection::Type>(builder,10,off_00);
  FlatBufferBuilderImpl<false>::AddOffset<flatbuffers::String>(builder,4,off);
  table.o = FlatBufferBuilderImpl<false>::EndTable(builder,start);
  FlatBufferBuilderImpl<false>::Required<reflection::EnumVal>(builder,table,4);
  return (Offset<reflection::EnumVal>)table.o;
}

Assistant:

Offset<reflection::EnumVal> EnumVal::Serialize(FlatBufferBuilder *builder,
                                               const Parser &parser) const {
  const auto name__ = builder->CreateString(name);
  const auto type__ = union_type.Serialize(builder);
  const auto attr__ = SerializeAttributes(builder, parser);
  const auto docs__ = parser.opts.binary_schema_comments && !doc_comment.empty()
                          ? builder->CreateVectorOfStrings(doc_comment)
                          : 0;
  return reflection::CreateEnumVal(*builder, name__, value, type__, docs__,
                                   attr__);
}